

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerNode::TimerNode(TimerNode *this,TimerNode *tn)

{
  TimerNode *tn_local;
  TimerNode *this_local;
  
  this->expiredTime_ = 0;
  std::shared_ptr<HttpData>::shared_ptr(&this->SPHttpData,&tn->SPHttpData);
  return;
}

Assistant:

TimerNode::TimerNode(TimerNode &tn)
    : SPHttpData(tn.SPHttpData), expiredTime_(0) {}